

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal.cpp
# Opt level: O2

void __thiscall unodb::detail::dump_val(detail *this,ostream *os,value_view v)

{
  ostream *poVar1;
  size_t i;
  pointer pbVar2;
  
  poVar1 = std::operator<<((ostream *)this,"val(");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,"): 0x");
  for (pbVar2 = (pointer)0x0; v._M_ptr != pbVar2; pbVar2 = pbVar2 + 1) {
    dump_byte((ostream *)this,(byte)os[(long)pbVar2]);
  }
  return;
}

Assistant:

[[gnu::cold]] UNODB_DETAIL_NOINLINE void dump_val(std::ostream &os,
                                                  unodb::value_view v) {
  const auto sz = v.size_bytes();
  os << "val(" << sz << "): 0x";
  for (std::size_t i = 0; i < sz; ++i) dump_byte(os, v[i]);
}